

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_double_to_bignum(sexp ctx,double f)

{
  undefined4 uVar1;
  undefined8 uVar2;
  sexp ctx_00;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp scale;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  int sign;
  sexp in_stack_ffffffffffffff98;
  sexp b;
  sexp ctx_01;
  sexp dst;
  undefined1 local_48 [24];
  sexp_gc_var_t local_30;
  undefined4 in_stack_ffffffffffffffe8;
  
  memset(&local_30,0,0x10);
  local_48._16_8_ = 0x43e;
  memset(local_48,0,0x10);
  memset(&stack0xffffffffffffffa0,0,0x10);
  local_30.var = (sexp_conflict *)&stack0xffffffffffffffe0;
  local_30.next = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = &local_30;
  local_48._0_8_ = local_48 + 0x10;
  local_48._8_8_ = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)local_48;
  ctx_01 = (sexp)&stack0xffffffffffffffb0;
  dst = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa0;
  uVar2 = sexp_fixnum_to_bignum(ctx_01,in_stack_ffffffffffffff98);
  local_48._16_8_ = sexp_fixnum_to_bignum(ctx_01,in_stack_ffffffffffffff98);
  uVar1 = 1;
  if ((double)in_XMM0_Qa < 0.0) {
    uVar1 = 0xffffffff;
  }
  for (in_XMM0_Qa = in_XMM0_Qa & 0x7fffffffffffffff; 1.0 <= (double)in_XMM0_Qa;
      in_XMM0_Qa = trunc((double)in_XMM0_Qa / 16.0)) {
    b = (sexp)local_48._16_8_;
    fmod((double)in_XMM0_Qa,16.0);
    ctx_00 = sexp_bignum_fxmul(unaff_retaddr,(sexp)in_RDI,(sexp)in_XMM0_Qa,
                               CONCAT44(uVar1,in_stack_ffffffffffffffe8),(int)((ulong)uVar2 >> 0x20)
                              );
    uVar2 = sexp_bignum_add(ctx_00,dst,ctx_01,b);
    local_48._16_8_ =
         sexp_bignum_fxmul(unaff_retaddr,(sexp)in_RDI,(sexp)in_XMM0_Qa,
                           CONCAT44(uVar1,in_stack_ffffffffffffffe8),(int)((ulong)uVar2 >> 0x20));
  }
  (((sexp)uVar2)->value).flonum_bits[0] = (char)uVar1;
  (((sexp)in_RDI)->value).context.saves = local_30.next;
  return (sexp)uVar2;
}

Assistant:

sexp sexp_double_to_bignum (sexp ctx, double f) {
  int sign;
  sexp_gc_var3(res, scale, tmp);
  sexp_gc_preserve3(ctx, res, scale, tmp);
  res = sexp_fixnum_to_bignum(ctx, SEXP_ZERO);
  scale = sexp_fixnum_to_bignum(ctx, SEXP_ONE);
  sign = (f < 0 ? -1 : 1);
  for (f=fabs(f); f >= 1.0; f=trunc(f/16)) {
    tmp = sexp_bignum_fxmul(ctx, NULL, scale, (sexp_uint_t)double_16s_digit(f), 0);
    res = sexp_bignum_add(ctx, res, res, tmp);
    scale = sexp_bignum_fxmul(ctx, NULL, scale, 16, 0);
  }
  sexp_bignum_sign(res) = sign;
  sexp_gc_release3(ctx);
  return res;
}